

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O1

void burstsort2_vector(uchar **strings,size_t n)

{
  TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *root;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  
  root = (TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *
         )operator_new(0x18);
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  insert<8192u,std::vector<unsigned_char*,std::allocator<unsigned_char*>>,BurstSimple<unsigned_char>,unsigned_char>
            (root,strings,n);
  traverse<void(*)(unsigned_char**,int,int),std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
            (root,strings,0,in_RCX);
  return;
}

Assistant:

void burstsort2_vector(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef std::vector<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = new TrieNode<CharT, BucketT>;
	insert<8192, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}